

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O0

config * Configlist_add(rule *rp,int dot)

{
  char *pcVar1;
  int in_ESI;
  rule *in_RDI;
  config model;
  config *cfp;
  undefined4 in_stack_ffffffffffffffac;
  config *in_stack_ffffffffffffffd8;
  config *local_18;
  
  local_18 = Configtable_find((config *)CONCAT44(in_stack_ffffffffffffffac,in_ESI));
  if (local_18 == (config *)0x0) {
    local_18 = newconfig();
    local_18->rp = in_RDI;
    local_18->dot = in_ESI;
    pcVar1 = SetNew();
    local_18->fws = pcVar1;
    local_18->stp = (state *)0x0;
    local_18->bplp = (plink *)0x0;
    local_18->fplp = (plink *)0x0;
    local_18->next = (config *)0x0;
    local_18->bp = (config *)0x0;
    *currentend = local_18;
    currentend = &local_18->next;
    Configtable_insert(in_stack_ffffffffffffffd8);
  }
  return local_18;
}

Assistant:

struct config *Configlist_add(
  struct rule *rp,    /* The rule */
  int dot             /* Index into the RHS of the rule where the dot goes */
){
  struct config *cfp, model;

  assert( currentend!=0 );
  model.rp = rp;
  model.dot = dot;
  cfp = Configtable_find(&model);
  if( cfp==0 ){
    cfp = newconfig();
    cfp->rp = rp;
    cfp->dot = dot;
    cfp->fws = SetNew();
    cfp->stp = 0;
    cfp->fplp = cfp->bplp = 0;
    cfp->next = 0;
    cfp->bp = 0;
    *currentend = cfp;
    currentend = &cfp->next;
    Configtable_insert(cfp);
  }
  return cfp;
}